

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldState.cpp
# Opt level: O0

void __thiscall AI::WorldState::popChanges(WorldState *this)

{
  float fVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  size_t *psVar6;
  reference __k;
  mapped_type_conflict *pmVar7;
  reference ppVar8;
  pair<const_WorldStateIdentifier,_bool> *value_1;
  iterator __end1_2;
  iterator __begin1_2;
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  *__range1_2;
  pair<const_WorldStateIdentifier,_float> *value;
  iterator __end1_1;
  iterator __begin1_1;
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  *__range1_1;
  pair<const_WorldStateIdentifier,_bool> *flag;
  iterator __end1;
  iterator __begin1;
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  *__range1;
  value_type poppedChanges;
  WorldState *this_local;
  
  poppedChanges.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this
  ;
  sVar3 = std::vector<AI::StateChanges,_std::allocator<AI::StateChanges>_>::size(&this->changes);
  pvVar4 = std::vector<AI::StateChanges,_std::allocator<AI::StateChanges>_>::operator[]
                     (&this->changes,sVar3 - 1);
  StateChanges::StateChanges((StateChanges *)&__range1,pvVar4);
  std::vector<AI::StateChanges,_std::allocator<AI::StateChanges>_>::pop_back(&this->changes);
  __end1 = std::
           map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
           ::begin((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                    *)&__range1);
  flag = (pair<const_WorldStateIdentifier,_bool> *)
         std::
         map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
         ::end((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                *)&__range1);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&flag);
    if (!bVar2) break;
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_bool>_>::operator*
                       (&__end1);
    bVar2 = ppVar8->second;
    pmVar5 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                           *)this,&ppVar8->first);
    *pmVar5 = (mapped_type)(bVar2 & 1);
    std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_bool>_>::operator++(&__end1);
  }
  psVar6 = &poppedChanges.state.flags._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1_1 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::begin((map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                      *)psVar6);
  value = (pair<const_WorldStateIdentifier,_float> *)
          std::
          map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
          ::end((map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                 *)psVar6);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&value);
    if (!bVar2) break;
    __k = std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_float>_>::operator*
                    (&__end1_1);
    fVar1 = __k->second;
    pmVar7 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::operator[](&(this->current).values,&__k->first);
    *pmVar7 = fVar1;
    std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_float>_>::operator++(&__end1_1);
  }
  psVar6 = &poppedChanges.state.vectors._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1_2 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::begin((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                      *)psVar6);
  value_1 = (pair<const_WorldStateIdentifier,_bool> *)
            std::
            map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
            ::end((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                   *)psVar6);
  while( true ) {
    bVar2 = std::operator!=(&__end1_2,(_Self *)&value_1);
    if (!bVar2) break;
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_bool>_>::operator*
                       (&__end1_2);
    if ((ppVar8->second & 1U) == 0) {
      std::
      map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
      ::erase(&(this->current).values,&ppVar8->first);
    }
    else {
      std::
      map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
      ::operator[](&(this->current).values,&ppVar8->first);
    }
    std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_bool>_>::operator++(&__end1_2);
  }
  StateChanges::~StateChanges((StateChanges *)&__range1);
  return;
}

Assistant:

void WorldState::popChanges()
	{
		auto poppedChanges = changes[changes.size() - 1];
		changes.pop_back();

		for (auto& flag : poppedChanges.state.flags)
		{
			current.flags[flag.first] = flag.second;
		}

		for (auto& value : poppedChanges.state.values)
		{
			current.values[value.first] = value.second;
		}

		for (auto& value : poppedChanges.valuesAddedOrRemoved)
		{
			if (value.second)
			{
				current.values[value.first];
			}
			else
			{
				current.values.erase(value.first);
			}
		}
	}